

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::FileDescriptorProto::ByteSizeLong(FileDescriptorProto *this)

{
  RepeatedField<int> *pRVar1;
  int iVar2;
  int iVar3;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 aVar4;
  uint uVar5;
  uint uVar6;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar7;
  Rep *pRVar8;
  size_t sVar9;
  size_t sVar10;
  uint uVar11;
  int n_1;
  ulong uVar12;
  long lVar13;
  RepeatedPtrField<google::protobuf::DescriptorProto> *pRVar14;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *pRVar15;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *pRVar16;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar17;
  int n;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_01;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *this_02;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_03;
  
  uVar6 = *(uint *)((long)&this->field_0 + 0x10);
  uVar12 = (ulong)uVar6;
  if (0 < (int)uVar6) {
    uVar11 = 0;
    do {
      pVVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.dependency_.super_RepeatedPtrFieldBase,uVar11);
      uVar5 = (uint)pVVar7->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar12 = uVar12 + pVVar7->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x28);
  this_00 = &(this->field_0)._impl_.message_type_;
  pRVar14 = this_00;
  if ((*(byte *)((long)&this->field_0 + 0x20) & 1) != 0) {
    pRVar8 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    pRVar14 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)pRVar8->elements;
  }
  if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar8 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    this_00 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)pRVar8->elements;
  }
  lVar13 = uVar12 + (long)iVar2;
  iVar2 = *(int *)((long)&this->field_0 + 0x28);
  for (; pRVar14 !=
         (RepeatedPtrField<google::protobuf::DescriptorProto> *)
         (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar2);
      pRVar14 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)
                &(pRVar14->super_RepeatedPtrFieldBase).current_size_) {
    sVar9 = DescriptorProto::ByteSizeLong
                      ((DescriptorProto *)(pRVar14->super_RepeatedPtrFieldBase).tagged_rep_or_elem_)
    ;
    uVar6 = (uint)sVar9 | 1;
    iVar3 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    lVar13 = lVar13 + sVar9 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x40);
  this_01 = &(this->field_0)._impl_.enum_type_;
  pRVar15 = this_01;
  if ((*(byte *)((long)&this->field_0 + 0x38) & 1) != 0) {
    pRVar8 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
    pRVar15 = (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)pRVar8->elements;
  }
  if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar8 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
    this_01 = (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)pRVar8->elements;
  }
  lVar13 = lVar13 + iVar2;
  iVar2 = *(int *)((long)&this->field_0 + 0x40);
  for (; pRVar15 !=
         (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)
         (&(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar2);
      pRVar15 = (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)
                &(pRVar15->super_RepeatedPtrFieldBase).current_size_) {
    sVar9 = EnumDescriptorProto::ByteSizeLong
                      ((EnumDescriptorProto *)
                       (pRVar15->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar6 = (uint)sVar9 | 1;
    iVar3 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    lVar13 = lVar13 + sVar9 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x58);
  this_02 = &(this->field_0)._impl_.service_;
  pRVar16 = this_02;
  if ((*(byte *)((long)&this->field_0 + 0x50) & 1) != 0) {
    pRVar8 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
    pRVar16 = (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)pRVar8->elements;
  }
  if (((ulong)(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar8 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
    this_02 = (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)pRVar8->elements;
  }
  lVar13 = lVar13 + iVar2;
  iVar2 = *(int *)((long)&this->field_0 + 0x58);
  for (; pRVar16 !=
         (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)
         (&(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar2);
      pRVar16 = (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)
                &(pRVar16->super_RepeatedPtrFieldBase).current_size_) {
    sVar9 = ServiceDescriptorProto::ByteSizeLong
                      ((ServiceDescriptorProto *)
                       (pRVar16->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar6 = (uint)sVar9 | 1;
    iVar3 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    lVar13 = lVar13 + sVar9 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x70);
  this_03 = &(this->field_0)._impl_.extension_;
  pRVar17 = this_03;
  if ((*(byte *)((long)&this->field_0 + 0x68) & 1) != 0) {
    pRVar8 = internal::RepeatedPtrFieldBase::rep(&this_03->super_RepeatedPtrFieldBase);
    pRVar17 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar8->elements;
  }
  if (((ulong)(this_03->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar8 = internal::RepeatedPtrFieldBase::rep(&this_03->super_RepeatedPtrFieldBase);
    this_03 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar8->elements;
  }
  lVar13 = lVar13 + iVar2;
  iVar2 = *(int *)((long)&this->field_0 + 0x70);
  for (; pRVar17 !=
         (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
         (&(this_03->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar2);
      pRVar17 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
                &(pRVar17->super_RepeatedPtrFieldBase).current_size_) {
    sVar9 = FieldDescriptorProto::ByteSizeLong
                      ((FieldDescriptorProto *)
                       (pRVar17->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar6 = (uint)sVar9 | 1;
    iVar3 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    lVar13 = lVar13 + sVar9 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  pRVar1 = &(this->field_0)._impl_.public_dependency_;
  sVar9 = internal::WireFormatLite::Int32Size(pRVar1);
  uVar11 = internal::SooRep::size
                     (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x80) & 4) == 0);
  pRVar1 = &(this->field_0)._impl_.weak_dependency_;
  sVar10 = internal::WireFormatLite::Int32Size(pRVar1);
  uVar5 = internal::SooRep::size
                    (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x90) & 4) == 0);
  uVar6 = *(uint *)((long)&this->field_0 + 0xa8);
  sVar9 = uVar11 + sVar9 + sVar10 + (ulong)uVar5 + lVar13 + (ulong)uVar6;
  if (0 < (int)uVar6) {
    uVar11 = 0;
    do {
      pVVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.option_dependency_.super_RepeatedPtrFieldBase,
                          uVar11);
      uVar5 = (uint)pVVar7->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar9 = sVar9 + pVVar7->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
  }
  aVar4 = this->field_0;
  if (((undefined1  [232])aVar4 & (undefined1  [232])0x3f) != (undefined1  [232])0x0) {
    if (((undefined1  [232])aVar4 & (undefined1  [232])0x1) != (undefined1  [232])0x0) {
      lVar13 = *(long *)(((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
                        + 8);
      uVar6 = (uint)lVar13 | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar9 = sVar9 + lVar13 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [232])aVar4 & (undefined1  [232])0x2) != (undefined1  [232])0x0) {
      lVar13 = *(long *)(((ulong)(this->field_0)._impl_.package_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar6 = (uint)lVar13 | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar9 = sVar9 + lVar13 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [232])aVar4 & (undefined1  [232])0x4) != (undefined1  [232])0x0) {
      lVar13 = *(long *)(((ulong)(this->field_0)._impl_.syntax_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar6 = (uint)lVar13 | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar9 = sVar9 + lVar13 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [232])aVar4 & (undefined1  [232])0x8) != (undefined1  [232])0x0) {
      sVar10 = FileOptions::ByteSizeLong((this->field_0)._impl_.options_);
      uVar6 = (uint)sVar10 | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar9 = sVar9 + sVar10 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [232])aVar4 & (undefined1  [232])0x10) != (undefined1  [232])0x0) {
      sVar10 = SourceCodeInfo::ByteSizeLong((this->field_0)._impl_.source_code_info_);
      uVar6 = (uint)sVar10 | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar9 = sVar9 + sVar10 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [232])aVar4 & (undefined1  [232])0x20) != (undefined1  [232])0x0) {
      uVar12 = (long)(this->field_0)._impl_.edition_ | 1;
      lVar13 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      sVar9 = sVar9 + ((int)lVar13 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar9 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar9,&(this->field_0)._impl_._cached_size_);
  return sVar9;
}

Assistant:

::size_t FileDescriptorProto::ByteSizeLong() const {
  const FileDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FileDescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated string dependency = 3;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_dependency().size());
      for (int i = 0, n = this_._internal_dependency().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_dependency().Get(i));
      }
    }
    // repeated .google.protobuf.DescriptorProto message_type = 4;
    {
      total_size += 1UL * this_._internal_message_type_size();
      for (const auto& msg : this_._internal_message_type()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
    {
      total_size += 1UL * this_._internal_enum_type_size();
      for (const auto& msg : this_._internal_enum_type()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.ServiceDescriptorProto service = 6;
    {
      total_size += 1UL * this_._internal_service_size();
      for (const auto& msg : this_._internal_service()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.FieldDescriptorProto extension = 7;
    {
      total_size += 1UL * this_._internal_extension_size();
      for (const auto& msg : this_._internal_extension()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated int32 public_dependency = 10;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_public_dependency());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_public_dependency_size());
      total_size += tag_size + data_size;
    }
    // repeated int32 weak_dependency = 11;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_weak_dependency());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_weak_dependency_size());
      total_size += tag_size + data_size;
    }
    // repeated string option_dependency = 15;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_option_dependency().size());
      for (int i = 0, n = this_._internal_option_dependency().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_option_dependency().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional string package = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_package());
    }
    // optional string syntax = 12;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_syntax());
    }
    // optional .google.protobuf.FileOptions options = 8;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
    // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.source_code_info_);
    }
    // optional .google.protobuf.Edition edition = 14;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_edition());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}